

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_2::SampleMaskUniqueSetCase::postTest
          (SampleMaskUniqueSetCase *this)

{
  ostringstream *poVar1;
  ostringstream *this_00;
  int width;
  int height;
  pointer pSVar2;
  TestLog *log;
  byte bVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  uint uVar6;
  _Rb_tree_node_base *p_Var7;
  bool bVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  bool bVar18;
  int iVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  Vector<int,_4> res;
  vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_> sampleCoverage;
  deUint32 mask;
  ScopedLogSection section;
  int local_260;
  int local_258;
  undefined1 local_238 [32];
  _Rb_tree_node_base *local_218;
  size_t local_210;
  ulong local_208;
  vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_> local_200;
  ChannelOrder local_1e4;
  ScopedLogSection local_1e0;
  long local_1d8;
  long local_1d0;
  long local_1c8;
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  pSVar2 = (this->m_iterationSampleBuffers).
           super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>._M_impl.
           super__Vector_impl_data._M_start;
  width = pSVar2->m_width;
  height = pSVar2->m_height;
  std::vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>::vector
            (&local_200,
             (long)(this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                   super_MultisampleRenderCase.m_numTargetSamples,(allocator_type *)local_1b0);
  log = ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
         super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_1b0._0_8_ = (long)local_1b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"Verify","");
  local_238._0_8_ = (long)local_238 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"Verify masks","");
  tcu::ScopedLogSection::ScopedLogSection(&local_1e0,log,(string *)local_1b0,(string *)local_238);
  if (local_238._0_8_ != (long)local_238 + 0x10) {
    operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
  }
  if (local_1b0._0_8_ != (long)local_1b0 + 0x10) {
    operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
  }
  if (0 < (int)((ulong)((long)local_200.
                              super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_200.
                             super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333) {
    uVar14 = 0;
    do {
      local_1b0._0_4_ = R;
      local_1b0._4_4_ = UNSIGNED_INT32;
      tcu::TextureLevel::setStorage
                (local_200.super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar14,(TextureFormat *)local_1b0,width
                 ,height,1);
      uVar13 = uVar14;
      if (0 < height) {
        iVar17 = 0;
        local_208 = uVar14;
        do {
          if (0 < width) {
            iVar19 = 0;
            do {
              pSVar2 = (this->m_iterationSampleBuffers).
                       super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>._M_impl.
                       super__Vector_impl_data._M_start;
              uVar9 = *(uint *)((long)pSVar2[uVar14].m_pixels.m_ptr +
                               (long)(pSVar2[uVar14].m_width * iVar17 + iVar19) * 4);
              iVar10 = (int)((ulong)((long)local_200.
                                           super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_200.
                                          super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                       -0x33333333 + (int)uVar13;
              uVar6 = *(uint *)((long)pSVar2[iVar10].m_pixels.m_ptr +
                               (long)(pSVar2[iVar10].m_width * iVar17 + iVar19) * 4);
              tcu::TextureLevel::getAccess
                        ((PixelBufferAccess *)local_1b0,
                         local_200.
                         super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>.
                         _M_impl.super__Vector_impl_data._M_start + uVar14);
              fVar20 = floorf(((float)(uVar6 >> 0x10 & 0xff) / 255.0) * 31.0 + 0.5);
              fVar21 = floorf(((float)(uVar6 >> 8 & 0xff) / 255.0) * 63.0 + 0.5);
              fVar22 = floorf(((float)(uVar6 & 0xff) / 255.0) * 31.0 + 0.5);
              fVar23 = floorf(((float)(uVar9 >> 8 & 0xff) / 255.0) * 63.0 + 0.5);
              fVar24 = floorf(((float)(uVar9 & 0xff) / 255.0) * 31.0 + 0.5);
              fVar25 = floorf(((float)(uVar9 >> 0x10 & 0xff) / 255.0) * 31.0 + 0.5);
              local_238._0_4_ =
                   ((int)fVar25 << 0xb | (int)fVar24 | (int)fVar23 << 5) & 0xffff |
                   (int)fVar22 << 0x10 | (int)fVar21 << 0x15 | (int)fVar20 << 0x1b;
              local_238._4_4_ = SNORM_INT8;
              local_238._8_4_ = _S_red;
              local_238._12_4_ = 0;
              tcu::PixelBufferAccess::setPixel
                        ((PixelBufferAccess *)local_1b0,(IVec4 *)local_238,iVar19,iVar17,0);
              iVar19 = iVar19 + 1;
              uVar13 = local_208;
            } while (width != iVar19);
          }
          iVar17 = iVar17 + 1;
        } while (iVar17 != height);
      }
      uVar14 = uVar13 + 1;
    } while ((long)uVar14 <
             (long)((int)((ulong)((long)local_200.
                                        super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_200.
                                       super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                   -0x33333333));
  }
  if ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
      m_numRequestedSamples == 0) {
    local_1b0._0_8_ =
         ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
          super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Verifying sample mask is 0x00000001.",0x24);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    if (height < 1) goto LAB_0040e5be;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    iVar17 = 0;
    bVar8 = true;
    iVar19 = 0;
    do {
      if (0 < width) {
        iVar10 = 0;
        do {
          tcu::TextureLevel::getAccess
                    ((PixelBufferAccess *)local_1b0,
                     local_200.
                     super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>.
                     _M_impl.super__Vector_impl_data._M_start);
          tcu::ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)local_238,(int)(MessageBuilder *)local_1b0,iVar10,
                     iVar19);
          uVar4 = local_238._0_4_;
          if (local_238._0_4_ != A) {
            iVar17 = iVar17 + 1;
            if (iVar17 < 6) {
              local_1b0._0_8_ =
                   ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                    super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx)->m_log;
              std::__cxx11::ostringstream::ostringstream(poVar1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Pixel (",7);
              std::ostream::operator<<(poVar1,iVar10);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
              std::ostream::operator<<(poVar1,iVar19);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,"): Invalid mask, got ",0x15);
              local_238._4_4_ = SNORM_INT8;
              local_238._0_4_ = uVar4;
              tcu::Format::Hex<8UL>::toStream((Hex<8UL> *)local_238,(ostream *)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,", expected ",0xb);
              local_238._0_4_ = A;
              local_238._4_4_ = SNORM_INT8;
              tcu::Format::Hex<8UL>::toStream((Hex<8UL> *)local_238,(ostream *)poVar1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(poVar1);
              std::ios_base::~ios_base(local_138);
            }
            bVar8 = false;
          }
          iVar10 = iVar10 + 1;
        } while (width != iVar10);
      }
      iVar19 = iVar19 + 1;
    } while (iVar19 != height);
    if (iVar17 < 6 || bVar8) goto LAB_0040e4f0;
    local_1b0._0_8_ =
         ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
          super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"...\n",4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Omitted ",8);
    std::ostream::operator<<(poVar1,iVar17 + -5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1," error descriptions.",0x14);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_0040e58d:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
    std::ios_base::~ios_base(local_138);
  }
  else {
    local_1b0._0_8_ =
         ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
          super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Verifying invocation sample masks do not share bits.",0x34);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    if (height < 1) {
      bVar8 = true;
    }
    else {
      bVar18 = true;
      iVar17 = 0;
      local_260 = 0;
      do {
        if (0 < width) {
          iVar19 = (this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                   super_MultisampleRenderCase.m_numTargetSamples;
          local_258 = 0;
          do {
            if (0 < iVar19) {
              lVar16 = 2;
              lVar15 = 0x28;
              bVar3 = 0;
              lVar12 = 0;
              do {
                local_1c8 = lVar12 + 1;
                bVar8 = (bool)(4 < iVar17 & bVar3);
                local_1d8 = lVar15;
                local_1d0 = lVar16;
                if ((iVar19 <= local_1c8) || (bVar8)) {
                  lVar11 = (long)iVar19;
                }
                else {
                  do {
                    tcu::TextureLevel::getAccess
                              ((PixelBufferAccess *)local_1b0,
                               local_200.
                               super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar12);
                    iVar19 = (int)(PixelBufferAccess *)local_1b0;
                    tcu::ConstPixelBufferAccess::getPixelInt
                              ((ConstPixelBufferAccess *)local_238,iVar19,local_258,local_260);
                    uVar4 = local_238._0_4_;
                    tcu::TextureLevel::getAccess
                              ((PixelBufferAccess *)local_1b0,
                               (TextureLevel *)
                               ((long)((local_200.
                                        super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->m_size).m_data +
                               lVar15 + -8));
                    tcu::ConstPixelBufferAccess::getPixelInt
                              ((ConstPixelBufferAccess *)local_238,iVar19,local_258,local_260);
                    uVar5 = local_238._0_4_;
                    if ((local_238._0_4_ & uVar4) != R && uVar4 != local_238._0_4_) {
                      iVar17 = iVar17 + 1;
                      bVar3 = 1;
                      if (iVar17 < 6) {
                        local_1b0._0_8_ =
                             ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                              super_MultisampleRenderCase.super_TestCase.super_TestCase.
                              super_TestNode.m_testCtx)->m_log;
                        poVar1 = (ostringstream *)(local_1b0 + 8);
                        std::__cxx11::ostringstream::ostringstream(poVar1);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)poVar1,"Pixel (",7);
                        std::ostream::operator<<(poVar1,local_258);
                        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2)
                        ;
                        std::ostream::operator<<(poVar1,local_260);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)poVar1,"):\n",3);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)poVar1,"\tSamples ",9);
                        std::ostream::operator<<(poVar1,(int)lVar12);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)poVar1," and ",5);
                        local_208 = lVar16 - 1;
                        std::ostream::operator<<(poVar1,(int)local_208);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)poVar1," share mask bits\n",0x11);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)poVar1,"\tMask",5);
                        std::ostream::operator<<(poVar1,(int)lVar12);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)poVar1," = ",3);
                        local_238._4_4_ = SNORM_INT8;
                        local_238._0_4_ = uVar4;
                        tcu::Format::Hex<8UL>::toStream((Hex<8UL> *)local_238,(ostream *)poVar1);
                        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1)
                        ;
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)poVar1,"\tMask",5);
                        std::ostream::operator<<(poVar1,(int)local_208);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)poVar1," = ",3);
                        local_238._4_4_ = SNORM_INT8;
                        local_238._0_4_ = uVar5;
                        tcu::Format::Hex<8UL>::toStream((Hex<8UL> *)local_238,(ostream *)poVar1);
                        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1)
                        ;
                        tcu::MessageBuilder::operator<<
                                  ((MessageBuilder *)local_1b0,
                                   (EndMessageToken *)&tcu::TestLog::EndMessage);
                        std::__cxx11::ostringstream::~ostringstream(poVar1);
                        std::ios_base::~ios_base(local_138);
                      }
                      bVar18 = false;
                    }
                    iVar19 = (this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                             super_MultisampleRenderCase.m_numTargetSamples;
                    lVar11 = (long)iVar19;
                    bVar8 = (bool)(4 < iVar17 & bVar3);
                    if (lVar11 <= lVar16) break;
                    lVar16 = lVar16 + 1;
                    lVar15 = lVar15 + 0x28;
                  } while (!bVar8);
                }
                if (lVar11 <= local_1c8) break;
                lVar16 = local_1d0 + 1;
                lVar15 = local_1d8 + 0x28;
                lVar12 = local_1c8;
              } while (!bVar8);
            }
            local_258 = local_258 + 1;
          } while (local_258 != width);
        }
        local_260 = local_260 + 1;
      } while (local_260 != height);
      bVar8 = true;
      if (!bVar18) {
        if (5 < iVar17) {
          local_1b0._0_8_ =
               ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.m_testCtx)
               ->m_log;
          poVar1 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"...\n",4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Omitted ",8);
          std::ostream::operator<<(poVar1,iVar17 + -5);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1," error descriptions.",0x14);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base(local_138);
        }
        bVar8 = false;
      }
    }
    iVar17 = (this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
             super_MultisampleRenderCase.m_numTargetSamples;
    uVar6 = (iVar17 - (iVar17 + 1 >> 0x1f)) + 1 >> 1;
    uVar9 = 1;
    if (1 < (int)uVar6) {
      uVar9 = uVar6;
    }
    local_1b0._0_8_ =
         ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.super_MultisampleRenderCase.
          super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Verifying cardinality of separate sample mask bit sets. Expecting equal to the number of invocations, (greater or equal to "
               ,0x7b);
    local_208 = (ulong)uVar9;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    if (height < 1) {
      if (bVar8) goto LAB_0040e5be;
    }
    else {
      poVar1 = (ostringstream *)(local_1b0 + 8);
      bVar18 = true;
      iVar17 = 0;
      iVar19 = 0;
      do {
        if (0 < width) {
          iVar10 = 0;
          do {
            local_238._8_4_ = _S_red;
            local_238._16_8_ = 0;
            local_238._24_8_ = local_238 + 8;
            local_210 = 0;
            local_218 = (_Rb_tree_node_base *)local_238._24_8_;
            if ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                super_MultisampleRenderCase.m_numTargetSamples < 1) {
LAB_0040e313:
              iVar17 = iVar17 + 1;
              if (iVar17 < 6) {
                local_1b0._0_8_ =
                     ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                      super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx)->m_log;
                this_00 = (ostringstream *)(local_1b0 + 8);
                std::__cxx11::ostringstream::ostringstream(this_00);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Pixel (",7);
                std::ostream::operator<<(this_00,iVar10);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
                std::ostream::operator<<(this_00,iVar19);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)this_00,"): Pixel invocations had only ",0x1e);
                std::ostream::operator<<(this_00,(int)local_210);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)this_00," separate mask sets. Expected ",0x1e);
                std::ostream::_M_insert<unsigned_long>((ulong)this_00);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)this_00," or more. Found masks:",0x16);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::ostringstream::~ostringstream(this_00);
                std::ios_base::~ios_base(local_138);
                p_Var7 = (_Rb_tree_node_base *)local_238._24_8_;
                while (p_Var7 != (_Rb_tree_node_base *)(local_238 + 8)) {
                  local_1b0._0_8_ =
                       ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                        super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.
                       m_testCtx)->m_log;
                  std::__cxx11::ostringstream::ostringstream(poVar1);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tMask: ",7)
                  ;
                  local_1c0._4_4_ = SNORM_INT8;
                  local_1c0._0_4_ = p_Var7[1]._M_color;
                  tcu::Format::Hex<8UL>::toStream((Hex<8UL> *)local_1c0,(ostream *)poVar1);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_1b0,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
                  std::__cxx11::ostringstream::~ostringstream(poVar1);
                  std::ios_base::~ios_base(local_138);
                  p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
                }
                bVar18 = false;
              }
              else {
                bVar18 = false;
              }
            }
            else {
              lVar15 = 0;
              lVar12 = 0;
              do {
                tcu::TextureLevel::getAccess
                          ((PixelBufferAccess *)local_1b0,
                           (TextureLevel *)
                           ((long)((local_200.
                                    super__Vector_base<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_size).m_data +
                           lVar15 + -8));
                tcu::ConstPixelBufferAccess::getPixelInt
                          ((ConstPixelBufferAccess *)local_1c0,(int)(MessageBuilder *)local_1b0,
                           iVar10,iVar19);
                local_1e4 = local_1c0._0_4_;
                std::
                _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                ::_M_insert_unique<unsigned_int_const&>
                          ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                            *)local_238,&local_1e4);
                lVar12 = lVar12 + 1;
                lVar15 = lVar15 + 0x28;
              } while (lVar12 < (this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
                                super_MultisampleRenderCase.m_numTargetSamples);
              if ((int)local_210 < (int)uVar9) goto LAB_0040e313;
            }
            std::
            _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
            ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                         *)local_238);
            iVar10 = iVar10 + 1;
          } while (iVar10 != width);
        }
        iVar19 = iVar19 + 1;
      } while (iVar19 != height);
      if (bVar18) {
LAB_0040e4f0:
        if (bVar8) goto LAB_0040e5be;
      }
      else if (5 < iVar17) {
        local_1b0._0_8_ =
             ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
              super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
             m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"...\n",4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Omitted ",8);
        std::ostream::operator<<(poVar1,iVar17 + -5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1," error descriptions.",0x14);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_0040e58d;
      }
    }
  }
  tcu::TestContext::setTestResult
            ((this->super_SampleMaskBaseCase).super_MultisampleRenderCase.
             super_MultisampleRenderCase.super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             QP_TEST_RESULT_FAIL,"Image verification failed");
LAB_0040e5be:
  tcu::TestLog::endSection(local_1e0.m_log);
  std::vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>::~vector(&local_200);
  return;
}

Assistant:

void SampleMaskUniqueSetCase::postTest (void)
{
	DE_ASSERT((m_iterationSampleBuffers.size() % 2) == 0);
	DE_ASSERT((int)m_iterationSampleBuffers.size() / 2 == m_numTargetSamples);

	const int						width			= m_iterationSampleBuffers[0].getWidth();
	const int						height			= m_iterationSampleBuffers[0].getHeight();
	bool							allOk			= true;
	std::vector<tcu::TextureLevel>	sampleCoverage	(m_numTargetSamples);
	const tcu::ScopedLogSection		section			(m_testCtx.getLog(), "Verify", "Verify masks");

	// convert color layers to 32 bit coverage masks, 2 passes per coverage

	for (int sampleNdx = 0; sampleNdx < (int)sampleCoverage.size(); ++sampleNdx)
	{
		sampleCoverage[sampleNdx].setStorage(tcu::TextureFormat(tcu::TextureFormat::R, tcu::TextureFormat::UNSIGNED_INT32), width, height);

		for (int y = 0; y < height; ++y)
		for (int x = 0; x < width; ++x)
		{
			const tcu::RGBA		lowColor	= m_iterationSampleBuffers[sampleNdx].getPixel(x, y);
			const tcu::RGBA		highColor	= m_iterationSampleBuffers[sampleNdx + (int)sampleCoverage.size()].getPixel(x, y);
			deUint16			low;
			deUint16			high;

			{
				int redBits		= (int)deFloatRound((float)lowColor.getRed() / 255.0f * 31);
				int greenBits	= (int)deFloatRound((float)lowColor.getGreen() / 255.0f * 63);
				int blueBits	= (int)deFloatRound((float)lowColor.getBlue() / 255.0f * 31);

				low = (deUint16)(redBits | (greenBits << 5) | (blueBits << 11));
			}
			{
				int redBits		= (int)deFloatRound((float)highColor.getRed() / 255.0f * 31);
				int greenBits	= (int)deFloatRound((float)highColor.getGreen() / 255.0f * 63);
				int blueBits	= (int)deFloatRound((float)highColor.getBlue() / 255.0f * 31);

				high = (deUint16)(redBits | (greenBits << 5) | (blueBits << 11));
			}

			sampleCoverage[sampleNdx].getAccess().setPixel(tcu::UVec4((((deUint32)high) << 16) | low, 0, 0, 0), x, y);
		}
	}

	// verify masks

	if (m_numRequestedSamples == 0)
	{
		// single sample target, expect mask = 0x01
		const int	printFloodLimit	= 5;
		int			printCount		= 0;

		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying sample mask is 0x00000001." << tcu::TestLog::EndMessage;

		for (int y = 0; y < height; ++y)
		for (int x = 0; x < width; ++x)
		{
			deUint32 mask = sampleCoverage[0].getAccess().getPixelUint(x, y).x();
			if (mask != 0x01)
			{
				allOk = false;

				if (++printCount <= printFloodLimit)
				{
					m_testCtx.getLog()
						<< tcu::TestLog::Message
						<< "Pixel (" << x << ", " << y << "): Invalid mask, got " << tcu::Format::Hex<8>(mask) << ", expected " << tcu::Format::Hex<8>(0x01) << "\n"
						<< tcu::TestLog::EndMessage;
				}
			}
		}

		if (!allOk && printCount > printFloodLimit)
		{
			m_testCtx.getLog()
				<< tcu::TestLog::Message
				<< "...\n"
				<< "Omitted " << (printCount-printFloodLimit) << " error descriptions."
				<< tcu::TestLog::EndMessage;
		}
	}
	else
	{
		// check uniqueness
		{
			bool		uniquenessOk	= true;
			int			printCount		= 0;
			const int	printFloodLimit	= 5;

			m_testCtx.getLog() << tcu::TestLog::Message << "Verifying invocation sample masks do not share bits." << tcu::TestLog::EndMessage;

			for (int y = 0; y < height; ++y)
			for (int x = 0; x < width; ++x)
			{
				bool maskBitsNotUnique = false;

				for (int sampleNdxA = 0;            sampleNdxA < m_numTargetSamples && (!maskBitsNotUnique || printCount < printFloodLimit); ++sampleNdxA)
				for (int sampleNdxB = sampleNdxA+1; sampleNdxB < m_numTargetSamples && (!maskBitsNotUnique || printCount < printFloodLimit); ++sampleNdxB)
				{
					const deUint32 maskA = sampleCoverage[sampleNdxA].getAccess().getPixelUint(x, y).x();
					const deUint32 maskB = sampleCoverage[sampleNdxB].getAccess().getPixelUint(x, y).x();

					// equal mask == emitted by the same invocation
					if (maskA != maskB)
					{
						// shares samples?
						if (maskA & maskB)
						{
							maskBitsNotUnique = true;
							uniquenessOk = false;

							if (++printCount <= printFloodLimit)
							{
								m_testCtx.getLog()
									<< tcu::TestLog::Message
									<< "Pixel (" << x << ", " << y << "):\n"
									<< "\tSamples " << sampleNdxA << " and " << sampleNdxB << " share mask bits\n"
									<< "\tMask" << sampleNdxA << " = " << tcu::Format::Hex<8>(maskA) << "\n"
									<< "\tMask" << sampleNdxB << " = " << tcu::Format::Hex<8>(maskB) << "\n"
									<< tcu::TestLog::EndMessage;
							}
						}
					}
				}
			}

			if (!uniquenessOk)
			{
				allOk = false;

				if (printCount > printFloodLimit)
					m_testCtx.getLog()
						<< tcu::TestLog::Message
						<< "...\n"
						<< "Omitted " << (printCount-printFloodLimit) << " error descriptions."
						<< tcu::TestLog::EndMessage;
			}
		}

		// check number of sample mask bit groups is valid ( == number of invocations )
		{
			const deUint32			minNumInvocations	= (deUint32)de::max(1, (m_numTargetSamples+1)/2);
			bool					countOk				= true;
			int						printCount			= 0;
			const int				printFloodLimit		= 5;

			m_testCtx.getLog() << tcu::TestLog::Message << "Verifying cardinality of separate sample mask bit sets. Expecting equal to the number of invocations, (greater or equal to " << minNumInvocations << ")" << tcu::TestLog::EndMessage;

			for (int y = 0; y < height; ++y)
			for (int x = 0; x < width; ++x)
			{
				std::set<deUint32> masks;

				for (int maskNdx = 0; maskNdx < m_numTargetSamples; ++maskNdx)
				{
					const deUint32 mask = sampleCoverage[maskNdx].getAccess().getPixelUint(x, y).x();
					masks.insert(mask);
				}

				if ((int)masks.size() < (int)minNumInvocations)
				{
					if (++printCount <= printFloodLimit)
					{
						m_testCtx.getLog()
							<< tcu::TestLog::Message
							<< "Pixel (" << x << ", " << y << "): Pixel invocations had only " << (int)masks.size() << " separate mask sets. Expected " << minNumInvocations << " or more. Found masks:"
							<< tcu::TestLog::EndMessage;

						for (std::set<deUint32>::iterator it = masks.begin(); it != masks.end(); ++it)
							m_testCtx.getLog()
							<< tcu::TestLog::Message
							<< "\tMask: " << tcu::Format::Hex<8>(*it) << "\n"
							<< tcu::TestLog::EndMessage;
					}

					countOk = false;
				}
			}

			if (!countOk)
			{
				allOk = false;

				if (printCount > printFloodLimit)
					m_testCtx.getLog()
						<< tcu::TestLog::Message
						<< "...\n"
						<< "Omitted " << (printCount-printFloodLimit) << " error descriptions."
						<< tcu::TestLog::EndMessage;
			}
		}
	}

	if (!allOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
}